

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O0

void __thiscall
cs_impl::any::holder<cs::pointer>::holder<cs_impl::any>(holder<cs::pointer> *this,any *args)

{
  baseHolder *in_RDI;
  var *in_stack_ffffffffffffffb8;
  
  baseHolder::baseHolder(in_RDI);
  in_RDI->_vptr_baseHolder = (_func_int **)&PTR__holder_003de128;
  any((any *)in_RDI,in_stack_ffffffffffffffb8);
  cs::pointer::pointer((pointer *)in_RDI,in_stack_ffffffffffffffb8);
  ~any((any *)0x1eaac8);
  return;
}

Assistant:

explicit holder(ArgsT &&...args):mDat(std::forward<ArgsT>(args)...) {}